

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

WriteDescriptorResult __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PipelineClient::writeDescriptor
          (PipelineClient *this,Builder descriptor,Vector<int> *fds)

{
  ArrayPtr<const_capnp::PipelineOp> ops;
  BuilderArena *pBVar1;
  CapTableBuilder *pCVar2;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *pCVar3;
  Orphanage orphanage;
  WriteDescriptorResult WVar4;
  Builder promisedAnswer;
  OrphanBuilder OStack_a8;
  StructBuilder local_88;
  StructBuilder local_58;
  
  *(undefined2 *)descriptor._builder.data = 4;
  local_88.segment = descriptor._builder.segment;
  local_88.capTable = descriptor._builder.capTable;
  local_88.data = descriptor._builder.pointers;
  PointerBuilder::initStruct(&local_58,(PointerBuilder *)&local_88,(StructSize)0x10001);
  *(RemoveConst<int> *)local_58.data = fds[2].builder.pos[8];
  local_88.dataSize = descriptor._builder.dataSize;
  local_88.pointerCount = descriptor._builder.pointerCount;
  local_88._38_2_ = descriptor._builder._38_2_;
  local_88.data = descriptor._builder.data;
  local_88.pointers = descriptor._builder.pointers;
  local_88.segment = descriptor._builder.segment;
  local_88.capTable = descriptor._builder.capTable;
  pBVar1 = StructBuilder::getArena(&local_88);
  pCVar2 = StructBuilder::getCapTable(&local_88);
  ops.ptr = (PipelineOp *)fds[2].builder.endPtr;
  ops.size_ = (size_t)fds[2].builder.disposer;
  orphanage.capTable = pCVar2;
  orphanage.arena = pBVar1;
  anon_unknown_18::fromPipelineOps
            ((Orphan<capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>_> *)&OStack_a8,
             orphanage,ops);
  local_88.segment = local_58.segment;
  local_88.capTable = local_58.capTable;
  local_88.data = local_58.pointers;
  PointerBuilder::adopt((PointerBuilder *)&local_88,&OStack_a8);
  pCVar3 = extraout_RDX;
  if (OStack_a8.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&OStack_a8);
    pCVar3 = extraout_RDX_00;
  }
  *(undefined1 *)&(this->super_RpcClient).super_ClientHook._vptr_ClientHook = 0;
  (this->super_RpcClient).super_ClientHook.brand = fds;
  WVar4.described = pCVar3;
  WVar4.exportId.ptr = (NullableValue<unsigned_int>)this;
  return WVar4;
}

Assistant:

WriteDescriptorResult writeDescriptor(rpc::CapDescriptor::Builder descriptor,
                                          kj::Vector<int>& fds) override {
      auto promisedAnswer = descriptor.initReceiverAnswer();
      promisedAnswer.setQuestionId(questionRef->getId());
      promisedAnswer.adoptTransform(fromPipelineOps(
          Orphanage::getForMessageContaining(descriptor), ops));
      return {
        .exportId = kj::none,
        .described = *this,
      };
    }